

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

size_t spvc_compiler_get_num_required_extensions(spvc_compiler compiler)

{
  spvc_context_s *this;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSVar1;
  size_t sVar2;
  allocator local_31;
  string local_30;
  
  if (compiler->backend == SPVC_BACKEND_GLSL) {
    pSVar1 = spirv_cross::CompilerGLSL::get_required_extensions_abi_cxx11_
                       ((CompilerGLSL *)
                        (compiler->compiler)._M_t.
                        super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                        .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
    sVar2 = (pSVar1->
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).buffer_size;
  }
  else {
    this = compiler->context;
    std::__cxx11::string::string
              ((string *)&local_30,"Enabled extensions can only be queried on GLSL backend.",
               &local_31);
    spvc_context_s::report_error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    sVar2 = 0xfffffffffffffffc;
  }
  return sVar2;
}

Assistant:

size_t spvc_compiler_get_num_required_extensions(spvc_compiler compiler) 
{
#if SPIRV_CROSS_C_API_GLSL
	if (compiler->backend != SPVC_BACKEND_GLSL)
	{
		compiler->context->report_error("Enabled extensions can only be queried on GLSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	return static_cast<CompilerGLSL *>(compiler->compiler.get())->get_required_extensions().size();
#else
	compiler->context->report_error("Enabled extensions can only be queried on GLSL backend.");
	return 0;
#endif
}